

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticsReporter_DeclarationBinder.cpp
# Opt level: O2

void __thiscall
psy::C::DeclarationBinder::DiagnosticsReporter::TypeSpecifierMissingDefaultsToInt
          (DiagnosticsReporter *this,SyntaxToken *declTk)

{
  allocator<char> local_11a;
  allocator<char> local_119;
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  SyntaxToken local_b8;
  DiagnosticDescriptor local_78;
  
  std::__cxx11::string::string
            (local_d8,(string *)&ID_of_TypeSpecifierMissingDefaultsToInt_abi_cxx11_);
  std::__cxx11::string::string<std::allocator<char>>
            (local_f8,"[[type specifier missing]]",&local_119);
  std::__cxx11::string::string<std::allocator<char>>
            (local_118,"type specifier missing, defaults to `int\'",&local_11a);
  psy::DiagnosticDescriptor::DiagnosticDescriptor(&local_78,local_d8,local_f8,local_118,2,2);
  local_b8.field_10 = declTk->field_10;
  local_b8.tree_ = declTk->tree_;
  local_b8.syntaxK_ = declTk->syntaxK_;
  local_b8.byteSize_ = declTk->byteSize_;
  local_b8.charSize_ = declTk->charSize_;
  local_b8._14_2_ = *(undefined2 *)&declTk->field_0xe;
  local_b8.byteOffset_ = declTk->byteOffset_;
  local_b8.charOffset_ = declTk->charOffset_;
  local_b8.matchingBracket_ = declTk->matchingBracket_;
  local_b8.field_7 = declTk->field_7;
  local_b8._34_2_ = *(undefined2 *)&declTk->field_0x22;
  local_b8.lineno_ = declTk->lineno_;
  local_b8.column_ = declTk->column_;
  local_b8._44_4_ = *(undefined4 *)&declTk->field_0x2c;
  diagnose(this,&local_78,&local_b8);
  SyntaxToken::~SyntaxToken(&local_b8);
  DiagnosticDescriptor::~DiagnosticDescriptor(&local_78);
  std::__cxx11::string::~string(local_118);
  std::__cxx11::string::~string(local_f8);
  std::__cxx11::string::~string(local_d8);
  return;
}

Assistant:

void DeclarationBinder::DiagnosticsReporter::TypeSpecifierMissingDefaultsToInt(SyntaxToken declTk)
{
    diagnose(DiagnosticDescriptor(
                 ID_of_TypeSpecifierMissingDefaultsToInt,
                 "[[type specifier missing]]",
                 "type specifier missing, defaults to `int'",
                 DiagnosticSeverity::Error,
                 DiagnosticCategory::Binding),
             declTk);
}